

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

int __thiscall
iDynTree::ModelSolidShapes::copy(ModelSolidShapes *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  long lVar2;
  size_t geom;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  clear(this);
  std::
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  ::resize(&this->linkSolidShapes,(*(long *)(dst + 8) - *(long *)dst) / 0x18);
  lVar2 = *(long *)dst;
  for (uVar4 = 0; uVar4 < (ulong)((*(long *)(dst + 8) - lVar2) / 0x18); uVar4 = uVar4 + 1) {
    lVar5 = uVar4 * 0x18;
    std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::resize
              ((this->linkSolidShapes).
               super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4,
               *(long *)(lVar2 + 8 + lVar5) - *(long *)(lVar2 + lVar5) >> 3);
    uVar3 = 0;
    while( true ) {
      lVar2 = *(long *)dst;
      if ((ulong)(*(long *)(lVar2 + 8 + lVar5) - *(long *)(lVar2 + lVar5) >> 3) <= uVar3) break;
      uVar1 = (**(code **)(**(long **)(*(long *)(lVar2 + lVar5) + uVar3 * 8) + 0x10))();
      *(undefined8 *)
       (*(long *)&(this->linkSolidShapes).
                  super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].
                  super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                  ._M_impl + uVar3 * 8) = uVar1;
      uVar3 = uVar3 + 1;
    }
  }
  return (int)this;
}

Assistant:

ModelSolidShapes& ModelSolidShapes::copy(const ModelSolidShapes& other)
    {
        clear();
        this->linkSolidShapes.resize(other.linkSolidShapes.size());
        for (size_t link = 0; link < other.linkSolidShapes.size(); link++)
        {
            this->linkSolidShapes[link].resize(other.linkSolidShapes[link].size());
            for (size_t geom = 0; geom < other.linkSolidShapes[link].size(); geom++)
            {
                this->linkSolidShapes[link][geom] = other.linkSolidShapes[link][geom]->clone();
            }
        }

        return *this;
    }